

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.cc
# Opt level: O1

int CONF_parse_list(char *list,int sep,int nospc,list_cb *list_cb,void *arg)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  size_t sVar5;
  byte *pbVar6;
  
  if (list == (char *)0x0) {
    iVar3 = 0;
    ERR_put_error(0xd,0,100,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/conf/conf.cc"
                  ,0x248);
  }
  else {
    do {
      if (nospc != 0) {
        bVar2 = *list;
        while ((bVar2 != 0 && (iVar3 = OPENSSL_isspace((uint)bVar2), iVar3 != 0))) {
          bVar2 = ((byte *)list)[1];
          list = (char *)((byte *)list + 1);
        }
      }
      pbVar4 = (byte *)strchr(list,(int)(char)sep);
      if ((pbVar4 == (byte *)list) || (*list == 0)) {
        iVar3 = (*list_cb)((char *)0x0,0,arg);
      }
      else {
        pbVar6 = pbVar4;
        if (pbVar4 == (byte *)0x0) {
          sVar5 = strlen(list);
          pbVar6 = (byte *)list + sVar5;
        }
        if (nospc == 0) {
          pbVar6 = pbVar6 + -1;
        }
        else {
          do {
            pbVar1 = pbVar6 + -1;
            pbVar6 = pbVar6 + -1;
            iVar3 = OPENSSL_isspace((uint)*pbVar1);
          } while (iVar3 != 0);
        }
        iVar3 = (*list_cb)(list,((int)pbVar6 - (int)list) + 1,arg);
      }
      if (iVar3 < 1) {
        return iVar3;
      }
      list = (char *)(pbVar4 + 1);
    } while (pbVar4 != (byte *)0x0);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int CONF_parse_list(const char *list, char sep, int remove_whitespace,
                    int (*list_cb)(const char *elem, size_t len, void *usr),
                    void *arg) {
  int ret;
  const char *lstart, *tmpend, *p;

  if (list == NULL) {
    OPENSSL_PUT_ERROR(CONF, CONF_R_LIST_CANNOT_BE_NULL);
    return 0;
  }

  lstart = list;
  for (;;) {
    if (remove_whitespace) {
      while (*lstart && OPENSSL_isspace((unsigned char)*lstart)) {
        lstart++;
      }
    }
    p = strchr(lstart, sep);
    if (p == lstart || !*lstart) {
      ret = list_cb(NULL, 0, arg);
    } else {
      if (p) {
        tmpend = p - 1;
      } else {
        tmpend = lstart + strlen(lstart) - 1;
      }
      if (remove_whitespace) {
        while (OPENSSL_isspace((unsigned char)*tmpend)) {
          tmpend--;
        }
      }
      ret = list_cb(lstart, tmpend - lstart + 1, arg);
    }
    if (ret <= 0) {
      return ret;
    }
    if (p == NULL) {
      return 1;
    }
    lstart = p + 1;
  }
}